

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicStringPair>::readFrom
          (Property<Protocol::MQTT::Common::DynamicStringPair> *this,uint8 *buffer,uint32 bufLength)

{
  uint32 uVar1;
  
  uVar1 = 0xffffffff;
  if (((-1 < (char)*buffer) && (*buffer == (this->super_PropertyBase).type)) &&
     (uVar1 = 0xfffffffe, 4 < bufLength)) {
    uVar1 = Common::DynamicStringPair::readFrom
                      ((DynamicStringPair *)&(this->super_PropertyBase).field_0x19,buffer + 1,
                       bufLength - 1);
    uVar1 = uVar1 + (uVar1 < 0xfffffffd);
  }
  return uVar1;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if ((buffer[0] & 0x80) || buffer[0] != type) return BadData;
                    if (bufLength < 5) return NotEnoughData;
                    uint32 o = value.readFrom(buffer+1, bufLength - 1);
                    if (isError(o)) return o;
                    return o+1;
                }